

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_graph_compute(ggml_context *ctx,ggml_cgraph *cgraph)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  ggml_type gVar4;
  int iVar5;
  ggml_tensor *pgVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ggml_tensor *pgVar10;
  sbyte sVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  ulong unaff_RBX;
  pthread_t *ppVar15;
  ggml_cgraph *pgVar16;
  pthread_t __th;
  long lVar17;
  pthread_t pVar18;
  pthread_t *__newthread;
  long lVar19;
  pthread_t *ppVar20;
  long lVar21;
  ulong uVar22;
  size_t sVar23;
  undefined1 local_78 [8];
  ggml_compute_params params;
  undefined4 local_40;
  int local_3c;
  ggml_compute_state_shared state_shared;
  
  ppVar15 = (pthread_t *)local_78;
  if (cgraph->n_threads < 1) {
    cgraph->n_threads = 8;
  }
  iVar8 = cgraph->n_threads;
  uVar12 = (ulong)iVar8;
  local_40 = 0;
  local_3c = iVar8;
  state_shared.spin = 0;
  state_shared.n_threads._0_2_ = 0;
  params.wdata = ctx;
  ppVar20 = (pthread_t *)0x0;
  if (1 < (long)uVar12) {
    ppVar15 = (pthread_t *)(local_78 + -((ulong)(iVar8 - 1) * 0x38 + 0xf & 0xfffffffffffffff0));
    ppVar20 = ppVar15;
  }
  pgVar16 = cgraph;
  if (1 < iVar8) {
    LOCK();
    state_shared.n_threads._0_2_ = 1;
    UNLOCK();
    unaff_RBX = 0;
    uVar22 = 0;
    __newthread = ppVar20;
    do {
      if (iVar8 - 1 == uVar22) goto LAB_001269a7;
      pgVar10 = cgraph->work;
      if (pgVar10 == (ggml_tensor *)0x0) {
        uVar9 = 0;
        pvVar13 = (void *)0x0;
      }
      else {
        uVar9 = ((long)pgVar10->ne[3] * (long)pgVar10->ne[2] *
                 (long)pgVar10->ne[1] * (long)pgVar10->ne[0] * GGML_TYPE_SIZE[pgVar10->type]) /
                (ulong)(long)GGML_BLCK_SIZE[pgVar10->type];
        pvVar13 = pgVar10->data;
      }
      *__newthread = 0;
      *(undefined4 *)(__newthread + 1) = 1;
      uVar22 = uVar22 + 1;
      *(int *)((long)__newthread + 0xc) = (int)uVar22;
      *(int *)(__newthread + 2) = iVar8;
      __newthread[3] = uVar9;
      __newthread[4] = (pthread_t)pvVar13;
      __newthread[5] = 0;
      __newthread[6] = (pthread_t)&local_40;
      ppVar15[-1] = 0x126992;
      iVar7 = pthread_create(__newthread,(pthread_attr_t *)0x0,ggml_graph_compute_thread,__newthread
                            );
      __newthread = __newthread + 7;
    } while (iVar7 == 0);
    ppVar15[-1] = 0x1269a7;
    ggml_graph_compute_cold_1();
  }
LAB_001269a7:
  pvVar13 = params.wdata;
  __th = (pthread_t)pgVar16->n_nodes;
  if ((long)__th < 1) {
    uVar22 = 0;
  }
  else {
    lVar19 = uVar12 * 8;
    pVar18 = 0;
    uVar22 = 0;
    do {
      pgVar10 = pgVar16->nodes[pVar18];
      switch(pgVar10->op) {
      case GGML_OP_NONE:
      case GGML_OP_DUP:
      case GGML_OP_SUB:
      case GGML_OP_MUL:
      case GGML_OP_DIV:
      case GGML_OP_SQR:
      case GGML_OP_SQRT:
      case GGML_OP_SUM:
      case GGML_OP_MEAN:
      case GGML_OP_REPEAT:
      case GGML_OP_ABS:
      case GGML_OP_SGN:
      case GGML_OP_NEG:
      case GGML_OP_STEP:
      case GGML_OP_RELU:
      case GGML_OP_CPY:
      case GGML_OP_RESHAPE:
      case GGML_OP_VIEW:
      case GGML_OP_PERMUTE:
      case GGML_OP_TRANSPOSE:
      case GGML_OP_GET_ROWS:
      case GGML_OP_DIAG_MASK_INF:
      case GGML_OP_ROPE:
        pgVar10->n_tasks = 1;
        break;
      case GGML_OP_ADD:
      case GGML_OP_GELU:
      case GGML_OP_SILU:
      case GGML_OP_NORM:
      case GGML_OP_RMS_NORM:
      case GGML_OP_SCALE:
      case GGML_OP_SOFT_MAX:
        pgVar10->n_tasks = iVar8;
        break;
      case GGML_OP_MUL_MAT:
        pgVar10->n_tasks = iVar8;
        pgVar6 = pgVar10->src0;
        if (pgVar6->nb[1] < pgVar6->nb[0]) {
          unaff_RBX = (ulong)pgVar10->ne[2];
          uVar9 = (((long)pgVar10->ne[3] * unaff_RBX * (long)pgVar10->ne[1] * (long)pgVar10->ne[0] *
                   GGML_TYPE_SIZE[pgVar10->type]) / (ulong)(long)GGML_BLCK_SIZE[pgVar10->type]) *
                  uVar12;
        }
        else {
          gVar4 = pgVar6->type;
          switch(gVar4) {
          case GGML_TYPE_Q4_0:
switchD_00126b97_caseD_0:
            pgVar6 = pgVar10->src1;
            if (pgVar6->type == GGML_TYPE_F32) {
              uVar9 = (long)pgVar6->ne[3] * (long)pgVar6->ne[2] *
                      (long)pgVar6->ne[1] * (long)pgVar6->ne[0] * 0x14;
              goto LAB_00126c5b;
            }
            if (gVar4 == GGML_TYPE_Q4_1) break;
            goto switchD_00126b97_caseD_2;
          case GGML_TYPE_Q4_1:
            break;
          default:
            goto switchD_00126b97_caseD_2;
          case GGML_TYPE_F16:
            pgVar6 = pgVar10->src1;
            if (pgVar6->type == GGML_TYPE_F32) {
              unaff_RBX = (ulong)pgVar6->ne[2];
              uVar9 = (long)pgVar6->ne[3] * unaff_RBX * (long)pgVar6->ne[1] * (long)pgVar6->ne[0] *
                      2;
              goto LAB_00126c5f;
            }
            if (gVar4 == GGML_TYPE_Q4_0) goto switchD_00126b97_caseD_0;
            if (gVar4 != GGML_TYPE_Q4_1) {
              if (gVar4 == GGML_TYPE_F32) goto switchD_00126b97_caseD_6;
              goto switchD_00126b97_caseD_2;
            }
            break;
          case GGML_TYPE_F32:
switchD_00126b97_caseD_6:
            if (pgVar10->src1->type == GGML_TYPE_F32) {
              uVar9 = 0;
              goto LAB_00126c5f;
            }
            if (gVar4 != GGML_TYPE_Q4_1) {
              if (gVar4 == GGML_TYPE_Q4_0) goto switchD_00126b97_caseD_0;
              goto switchD_00126b97_caseD_2;
            }
          }
          pgVar10 = pgVar10->src1;
          if (pgVar10->type != GGML_TYPE_F32) goto switchD_00126b97_caseD_2;
          uVar9 = (long)pgVar10->ne[3] * (long)pgVar10->ne[2] *
                  (long)pgVar10->ne[1] * (long)pgVar10->ne[0] * 0x18;
LAB_00126c5b:
          uVar9 = uVar9 >> 5;
        }
LAB_00126c5f:
        pgVar16 = cgraph;
        if (uVar22 <= uVar9) {
          uVar22 = uVar9;
        }
        break;
      case GGML_OP_CONV_1D_1S:
      case GGML_OP_CONV_1D_2S:
        pgVar10->n_tasks = iVar8;
        pgVar6 = pgVar10->src0;
        if (pgVar6->ne[3] != 1) goto LAB_00127000;
        pgVar10 = pgVar10->src1;
        if (pgVar10->ne[2] != 1) goto LAB_00127005;
        if (pgVar10->ne[3] != 1) goto LAB_0012700a;
        gVar4 = pgVar6->type;
        uVar9 = (ulong)gVar4;
        uVar3 = pgVar6->ne[0];
        unaff_RBX = (ulong)uVar3;
        if (gVar4 == GGML_TYPE_F32) {
          sVar11 = 2;
          gVar4 = pgVar10->type;
        }
        else {
          if (gVar4 != GGML_TYPE_F16) goto LAB_00126ffb;
          sVar11 = 1;
          gVar4 = pgVar10->type;
        }
        if (gVar4 != GGML_TYPE_F32) goto LAB_00126ffb;
        uVar9 = (long)(int)(((uVar3 - ((int)uVar3 >> 0x1f) & 0xfffffffe) + pgVar10->ne[0]) *
                            pgVar10->ne[1] +
                           pgVar6->ne[2] * uVar3 * (pgVar6->ne[1] + 0x1fU & 0xffffffe0)) << sVar11;
        pgVar16 = cgraph;
        if (uVar22 <= uVar9) {
          uVar22 = uVar9;
        }
        break;
      case GGML_OP_FLASH_ATTN:
        pgVar10->n_tasks = iVar8;
        uVar14 = (long)pgVar10->src1->ne[1] + 3U & 0xfffffffffffffffc;
        gVar4 = pgVar10->src1->type;
        uVar9 = lVar19 * uVar14;
        if (gVar4 != GGML_TYPE_F32) {
          uVar9 = 0;
        }
        uVar14 = (int)uVar14 * lVar19;
        if (gVar4 != GGML_TYPE_F16) {
          uVar14 = uVar9;
        }
        pgVar16 = cgraph;
        if (uVar22 <= uVar14) {
          uVar22 = uVar14;
        }
        break;
      case GGML_OP_FLASH_FF:
        pgVar10->n_tasks = iVar8;
        pgVar10 = pgVar10->src1;
        if (pgVar10->type == GGML_TYPE_F32) {
          uVar9 = pgVar10->ne[1] * lVar19;
        }
        else {
          uVar9 = 0;
        }
        if (pgVar10->type == GGML_TYPE_F16) {
          uVar9 = pgVar10->ne[1] * lVar19;
        }
        pgVar16 = cgraph;
        if (uVar22 <= uVar9) {
          uVar22 = uVar9;
        }
        break;
      case GGML_OP_COUNT:
        goto switchD_001269ef_caseD_23;
      }
      pVar18 = pVar18 + 1;
    } while (__th != pVar18);
  }
  if ((pgVar16->work != (ggml_tensor *)0x0) && (pgVar16->work_size < uVar22)) {
LAB_0012700f:
    ppVar15[-1] = 0x127014;
    ggml_graph_compute_cold_9();
switchD_001269ef_caseD_23:
    ppVar15[-1] = 0x127019;
    ggml_graph_compute_cold_2();
switchD_00126b97_caseD_2:
    ppVar15[-1] = (pthread_t)ggml_graph_compute_thread;
    ggml_graph_compute_cold_7();
    ppVar15[-1] = (pthread_t)&stack0xfffffffffffffff8;
    ppVar15[-2] = uVar12;
    ppVar15[-3] = unaff_RBX;
    iVar8 = *(int *)(*(long *)(__th + 0x30) + 4);
    while( true ) {
      LOCK();
      piVar1 = (int *)(*(long *)(__th + 0x30) + 8);
      iVar7 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      if (iVar7 == iVar8 + -1) {
        LOCK();
        *(undefined1 *)(*(long *)(__th + 0x30) + 0xc) = 0;
        UNLOCK();
      }
      else {
        while ((*(byte *)(*(long *)(__th + 0x30) + 0xc) & 1) != 0) {
          if ((*(byte *)(*(long *)(__th + 0x30) + 0xd) & 1) != 0) {
            return;
          }
        }
      }
      LOCK();
      piVar1 = (int *)(*(long *)(__th + 0x30) + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      while (bVar2 = *(byte *)(*(long *)(__th + 0x30) + 0xd),
            (*(byte *)(*(long *)(__th + 0x30) + 0xc) & 1) == 0) {
        if ((bVar2 & 1) != 0) {
          return;
        }
      }
      if (((bVar2 & 1) != 0) ||
         (pgVar10 = *(ggml_tensor **)(__th + 0x28), pgVar10 == (ggml_tensor *)0x0)) break;
      if (*(int *)(__th + 0xc) < *(int *)(__th + 0x10)) {
        ppVar15[-4] = 0x1270a3;
        ggml_compute_forward((ggml_compute_params *)(__th + 8),pgVar10);
      }
      *(undefined8 *)(__th + 0x28) = 0;
    }
    return;
  }
  if (uVar22 != 0 && pgVar16->work == (ggml_tensor *)0x0) {
    sVar23 = uVar22 + (long)(iVar8 * 0x40 + -0x40);
    pgVar16->work_size = sVar23;
    local_78._0_4_ = (ggml_task_type)sVar23;
    ppVar15[-1] = 0x126cd1;
    pgVar10 = ggml_new_tensor_impl
                        ((ggml_context *)pvVar13,GGML_TYPE_I8,1,(int *)local_78,(void *)0x0);
    cgraph->work = pgVar10;
    pgVar16 = cgraph;
  }
  if (0 < pgVar16->n_nodes) {
    params.wdata = (void *)(ulong)(iVar8 - 1);
    lVar21 = (long)params.wdata * 0x38;
    lVar19 = 0;
    do {
      pgVar10 = pgVar16->nodes[lVar19];
      local_78._0_4_ = GGML_TASK_INIT;
      local_78._4_4_ = 0;
      params.type = pgVar10->n_tasks;
      pgVar6 = pgVar16->work;
      if (pgVar6 == (ggml_tensor *)0x0) {
        params.nth = 0;
        params._12_4_ = 0;
        params.wsize = 0;
      }
      else {
        params._8_8_ = ((long)pgVar6->ne[3] * (long)pgVar6->ne[2] *
                        (long)pgVar6->ne[1] * (long)pgVar6->ne[0] * GGML_TYPE_SIZE[pgVar6->type]) /
                       (ulong)(long)GGML_BLCK_SIZE[pgVar6->type];
        params.wsize = (size_t)pgVar6->data;
      }
      ppVar15[-1] = 0x126d71;
      ggml_compute_forward((ggml_compute_params *)local_78,pgVar10);
      if (1 < pgVar10->n_tasks) {
        LOCK();
        iVar7 = state_shared.spin + 1;
        UNLOCK();
        if (state_shared.spin == (int)params.wdata) {
          LOCK();
          state_shared.n_threads._0_2_ = (ushort)state_shared.n_threads & 0xff00;
          UNLOCK();
        }
        do {
        } while (((ushort)state_shared.n_threads & 1) != 0);
        state_shared.spin = iVar7;
        if (1 < iVar8) {
          pgVar6 = cgraph->work;
          iVar7 = 1;
          lVar17 = 0;
          do {
            iVar5 = pgVar10->n_tasks;
            if (pgVar6 == (ggml_tensor *)0x0) {
              uVar12 = 0;
              pvVar13 = (void *)0x0;
            }
            else {
              uVar12 = ((long)pgVar6->ne[3] * (long)pgVar6->ne[2] *
                        (long)pgVar6->ne[1] * (long)pgVar6->ne[0] * GGML_TYPE_SIZE[pgVar6->type]) /
                       (ulong)(long)GGML_BLCK_SIZE[pgVar6->type];
              pvVar13 = pgVar6->data;
            }
            *(undefined4 *)((long)ppVar20 + lVar17 + 8) = 1;
            *(int *)((long)ppVar20 + lVar17 + 0xc) = iVar7;
            *(int *)((long)ppVar20 + lVar17 + 0x10) = iVar5;
            *(ulong *)((long)ppVar20 + lVar17 + 0x18) = uVar12;
            *(void **)((long)ppVar20 + lVar17 + 0x20) = pvVar13;
            *(ggml_tensor **)((long)ppVar20 + lVar17 + 0x28) = pgVar10;
            lVar17 = lVar17 + 0x38;
            iVar7 = iVar7 + 1;
          } while (lVar21 - lVar17 != 0);
        }
        LOCK();
        state_shared.spin = state_shared.spin + -1;
        UNLOCK();
        do {
        } while (0 < state_shared.spin);
        LOCK();
        state_shared.n_threads._0_1_ = 1;
        UNLOCK();
      }
      local_78._0_4_ = GGML_TASK_COMPUTE;
      ppVar15[-1] = 0x126e50;
      ggml_compute_forward((ggml_compute_params *)local_78,pgVar10);
      if (1 < pgVar10->n_tasks) {
        LOCK();
        UNLOCK();
        if (state_shared.spin == (int)params.wdata) {
          LOCK();
          state_shared.n_threads._0_2_ = (ushort)state_shared.n_threads & 0xff00;
          UNLOCK();
        }
        do {
        } while (((ushort)state_shared.n_threads & 1) != 0);
        LOCK();
        UNLOCK();
        do {
        } while (state_shared.spin != 0);
      }
      if (1 < pgVar10->n_tasks) {
        LOCK();
        iVar7 = state_shared.spin + 1;
        UNLOCK();
        if (state_shared.spin == (int)params.wdata) {
          LOCK();
          state_shared.n_threads._0_2_ = (ushort)state_shared.n_threads & 0xff00;
          UNLOCK();
        }
        do {
        } while (((ushort)state_shared.n_threads & 1) != 0);
        state_shared.spin = iVar7;
        if (1 < iVar8) {
          pgVar6 = cgraph->work;
          iVar7 = 1;
          lVar17 = 0;
          do {
            iVar5 = pgVar10->n_tasks;
            if (pgVar6 == (ggml_tensor *)0x0) {
              uVar12 = 0;
              pvVar13 = (void *)0x0;
            }
            else {
              uVar12 = ((long)pgVar6->ne[3] * (long)pgVar6->ne[2] *
                        (long)pgVar6->ne[1] * (long)pgVar6->ne[0] * GGML_TYPE_SIZE[pgVar6->type]) /
                       (ulong)(long)GGML_BLCK_SIZE[pgVar6->type];
              pvVar13 = pgVar6->data;
            }
            *(undefined4 *)((long)ppVar20 + lVar17 + 8) = 2;
            *(int *)((long)ppVar20 + lVar17 + 0xc) = iVar7;
            *(int *)((long)ppVar20 + lVar17 + 0x10) = iVar5;
            *(ulong *)((long)ppVar20 + lVar17 + 0x18) = uVar12;
            *(void **)((long)ppVar20 + lVar17 + 0x20) = pvVar13;
            *(ggml_tensor **)((long)ppVar20 + lVar17 + 0x28) = pgVar10;
            lVar17 = lVar17 + 0x38;
            iVar7 = iVar7 + 1;
          } while (lVar21 - lVar17 != 0);
        }
        LOCK();
        state_shared.spin = state_shared.spin + -1;
        UNLOCK();
        do {
        } while (0 < state_shared.spin);
        LOCK();
        state_shared.n_threads._0_1_ = 1;
        UNLOCK();
      }
      local_78._0_4_ = GGML_TASK_FINALIZE;
      ppVar15[-1] = 0x126f5c;
      ggml_compute_forward((ggml_compute_params *)local_78,pgVar10);
      if (1 < pgVar10->n_tasks) {
        LOCK();
        UNLOCK();
        if (state_shared.spin == (int)params.wdata) {
          LOCK();
          state_shared.n_threads._0_2_ = (ushort)state_shared.n_threads & 0xff00;
          UNLOCK();
        }
        do {
        } while (((ushort)state_shared.n_threads & 1) != 0);
        LOCK();
        UNLOCK();
        do {
        } while (state_shared.spin != 0);
      }
      pgVar10->perf_runs = pgVar10->perf_runs + 1;
      lVar19 = lVar19 + 1;
      pgVar16 = cgraph;
    } while (lVar19 < cgraph->n_nodes);
  }
  if (1 < iVar8) {
    LOCK();
    UNLOCK();
    LOCK();
    state_shared.n_threads._0_2_ = 0x101;
    UNLOCK();
    unaff_RBX = (ulong)(iVar8 - 1) * 0x38;
    uVar9 = 0;
    do {
      __th = *(pthread_t *)((long)ppVar20 + uVar9);
      ppVar15[-1] = 0x126fd0;
      iVar8 = pthread_join(__th,(void **)0x0);
      if (iVar8 != 0) {
        ppVar15[-1] = 0x126ffb;
        ggml_graph_compute_cold_8();
LAB_00126ffb:
        ppVar15[-1] = 0x127000;
        ggml_graph_compute_cold_6();
        uVar12 = uVar9;
LAB_00127000:
        ppVar15[-1] = 0x127005;
        ggml_graph_compute_cold_3();
LAB_00127005:
        ppVar15[-1] = 0x12700a;
        ggml_graph_compute_cold_4();
LAB_0012700a:
        ppVar15[-1] = 0x12700f;
        ggml_graph_compute_cold_5();
        goto LAB_0012700f;
      }
      uVar9 = uVar9 + 0x38;
    } while (unaff_RBX - uVar9 != 0);
  }
  cgraph->perf_runs = cgraph->perf_runs + 1;
  return;
}

Assistant:

void ggml_graph_compute(struct ggml_context * ctx, struct ggml_cgraph * cgraph) {
    if (cgraph->n_threads <= 0) {
        cgraph->n_threads = 8;
    }

    const int n_threads = cgraph->n_threads;

    struct ggml_compute_state_shared state_shared = {
        /*.spin      =*/ GGML_LOCK_INITIALIZER,
        /*.n_threads =*/ n_threads,
        /*.n_ready   =*/ 0,
        /*.has_work  =*/ false,
        /*.stop      =*/ false,
    };
    struct ggml_compute_state * workers = n_threads > 1 ? alloca(sizeof(struct ggml_compute_state)*(n_threads - 1)) : NULL;

    // create thread pool
    if (n_threads > 1) {
        ggml_lock_init(&state_shared.spin);

        atomic_store(&state_shared.has_work, true);

        for (int j = 0; j < n_threads - 1; j++) {
            workers[j] = (struct ggml_compute_state) {
                .thrd   = 0,
                .params = {
                    .type  = GGML_TASK_COMPUTE,
                    .ith   = j + 1,
                    .nth   = n_threads,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                },
                .node   = NULL,
                .shared = &state_shared,
            };

            int rc = ggml_thread_create(&workers[j].thrd, NULL, ggml_graph_compute_thread, &workers[j]);
            GGML_ASSERT(rc == 0);
            UNUSED(rc);
        }
    }

    // initialize tasks + work buffer
    {
        size_t work_size = 0;

        // thread scheduling for the different operations
        for (int i = 0; i < cgraph->n_nodes; i++) {
            struct ggml_tensor * node = cgraph->nodes[i];

            switch (node->op) {
                case GGML_OP_DUP:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_ADD:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_SUB:
                case GGML_OP_MUL:
                case GGML_OP_DIV:
                case GGML_OP_SQR:
                case GGML_OP_SQRT:
                case GGML_OP_SUM:
                case GGML_OP_MEAN:
                case GGML_OP_REPEAT:
                case GGML_OP_ABS:
                case GGML_OP_SGN:
                case GGML_OP_NEG:
                case GGML_OP_STEP:
                case GGML_OP_RELU:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_GELU:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_SILU:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_NORM:
                case GGML_OP_RMS_NORM:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_MUL_MAT:
                    {
                        node->n_tasks = n_threads;

                        // TODO: use different scheduling for different matrix sizes
                        //const int nr0 = ggml_nrows(node->src0);
                        //const int nr1 = ggml_nrows(node->src1);

                        //node->n_tasks = MIN(n_threads, MAX(1, nr0/128));
                        //printf("nr0 = %8d, nr1 = %8d, nr0*nr1 = %8d, n_tasks = %d\n", nr0, nr1, nr0*nr1, node->n_tasks);

                        size_t cur = 0;

                        // TODO: better way to determine if the matrix is transposed
                        if (node->src0->nb[1] < node->src0->nb[0]) {
                            cur = ggml_nbytes(node)*node->n_tasks; // TODO: this can become (n_tasks-1)
                                                                   // TODO: overestimated by factor of x2 for FP16
                        } else {
                            if (node->src0->type == GGML_TYPE_F16 &&
                                node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1; // TODO: this actually is doing nothing
                                                       //       the threads are still spinning
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                    //printf("src0: ne0 = %d, ne1 = %d, ne = %d\n", node->src0->ne[0], node->src0->ne[1], node->src0->ne[0]*node->src0->ne[1]);
                                    //printf("src1: ne0 = %d, ne1 = %d, ne = %d\n", node->src1->ne[0], node->src1->ne[1], node->src1->ne[0]*node->src1->ne[1]);
                                    //printf("cur = %zu\n", cur);
                                } else {
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F16]*ggml_nelements(node->src1);
                                }
#else
                                cur = GGML_TYPE_SIZE[GGML_TYPE_F16]*ggml_nelements(node->src1);
#endif
                            } else if (node->src0->type == GGML_TYPE_F32 &&
                                       node->src1->type == GGML_TYPE_F32) {
                                cur = 0;
                            } else if (node->src0->type == GGML_TYPE_Q4_0 &&
                                       node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1;
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                } else {
                                    cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_0]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_0];
                                }
#else
                                cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_0]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_0];
#endif
                            } else if (node->src0->type == GGML_TYPE_Q4_1 &&
                                       node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1;
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                } else {
                                    cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_1]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_1];
                                }
#else
                                cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_1]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_1];
#endif
                            } else {
                                GGML_ASSERT(false);
                            }
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_SCALE:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_CPY:
                case GGML_OP_RESHAPE:
                case GGML_OP_VIEW:
                case GGML_OP_PERMUTE:
                case GGML_OP_TRANSPOSE:
                case GGML_OP_GET_ROWS:
                case GGML_OP_DIAG_MASK_INF:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_SOFT_MAX:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_ROPE:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_CONV_1D_1S:
                case GGML_OP_CONV_1D_2S:
                    {
                        node->n_tasks = n_threads;

                        GGML_ASSERT(node->src0->ne[3] == 1);
                        GGML_ASSERT(node->src1->ne[2] == 1);
                        GGML_ASSERT(node->src1->ne[3] == 1);

                        size_t cur = 0;
                        const int nk = node->src0->ne[0];

                        if (node->src0->type == GGML_TYPE_F16 &&
                            node->src1->type == GGML_TYPE_F32) {
                            cur = sizeof(ggml_fp16_t)*(
                                    nk*ggml_up32(node->src0->ne[1])*node->src0->ne[2] +
                                    ( 2*(nk/2) + node->src1->ne[0])*node->src1->ne[1]
                                    );
                        } else if (node->src0->type == GGML_TYPE_F32 &&
                                   node->src1->type == GGML_TYPE_F32) {
                            cur = sizeof(float)*(
                                    nk*ggml_up32(node->src0->ne[1])*node->src0->ne[2] +
                                    ( 2*(nk/2) + node->src1->ne[0])*node->src1->ne[1]
                                    );
                        } else {
                            GGML_ASSERT(false);
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_FLASH_ATTN:
                    {
                        node->n_tasks = n_threads;

                        size_t cur = 0;

                        const int ne11 = ggml_up(node->src1->ne[1], GGML_SOFT_MAX_UNROLL);

                        if (node->src1->type == GGML_TYPE_F32) {
                            cur  = sizeof(float)*ne11*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*ne11*node->n_tasks; // this is overestimated by x2
                        }

                        if (node->src1->type == GGML_TYPE_F16) {
                            cur  = sizeof(float)*ne11*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*ne11*node->n_tasks; // this is overestimated by x2
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_FLASH_FF:
                    {
                        node->n_tasks = n_threads;

                        size_t cur = 0;

                        if (node->src1->type == GGML_TYPE_F32) {
                            cur  = sizeof(float)*node->src1->ne[1]*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*node->src1->ne[1]*node->n_tasks; // this is overestimated by x2
                        }

                        if (node->src1->type == GGML_TYPE_F16) {
                            cur  = sizeof(float)*node->src1->ne[1]*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*node->src1->ne[1]*node->n_tasks; // this is overestimated by x2
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_NONE:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_COUNT:
                    {
                        GGML_ASSERT(false);
                    } break;
            }
        }

        if (cgraph->work != NULL && work_size > cgraph->work_size) {
            GGML_ASSERT(false); // TODO: better handling
        }

        if (work_size > 0 && cgraph->work == NULL) {
            cgraph->work_size = work_size + CACHE_LINE_SIZE*(n_threads - 1);

            GGML_PRINT_DEBUG("%s: allocating work buffer for graph (%zu bytes)\n", __func__, cgraph->work_size);
            cgraph->work = ggml_new_tensor_1d(ctx, GGML_TYPE_I8, cgraph->work_size);
        }
    }

    const int64_t perf_start_cycles  = ggml_perf_cycles();
    const int64_t perf_start_time_us = ggml_perf_time_us();

    for (int i = 0; i < cgraph->n_nodes; i++) {
        GGML_PRINT_DEBUG_5("%s: %d/%d\n", __func__, i, cgraph->n_nodes);

        struct ggml_tensor * node = cgraph->nodes[i];

        // TODO: this could be used to avoid unnecessary computations, but it needs to be improved
        //if (node->grad == NULL && node->perf_runs > 0) {
        //    continue;
        //}

        const int64_t perf_node_start_cycles  = ggml_perf_cycles();
        const int64_t perf_node_start_time_us = ggml_perf_time_us();

        // INIT
        struct ggml_compute_params params = {
            /*.type  =*/ GGML_TASK_INIT,
            /*.ith   =*/ 0,
            /*.nth   =*/ node->n_tasks,
            /*.wsize =*/ cgraph->work ? ggml_nbytes(cgraph->work) : 0,
            /*.wdata =*/ cgraph->work ? cgraph->work->data : NULL,
        };

        ggml_compute_forward(&params, node);

        // COMPUTE
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            // launch thread pool
            for (int j = 0; j < n_threads - 1; j++) {
                workers[j].params = (struct ggml_compute_params) {
                    .type  = GGML_TASK_COMPUTE,
                    .ith   = j + 1,
                    .nth   = node->n_tasks,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                };
                workers[j].node = node;
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) > 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_store(&state_shared.has_work, true);
        }

        params.type = GGML_TASK_COMPUTE;
        ggml_compute_forward(&params, node);

        // wait for thread pool
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) != 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }
        }

        // FINALIZE
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            // launch thread pool
            for (int j = 0; j < n_threads - 1; j++) {
                workers[j].params = (struct ggml_compute_params) {
                    .type  = GGML_TASK_FINALIZE,
                    .ith   = j + 1,
                    .nth   = node->n_tasks,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                };
                workers[j].node = node;
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) > 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_store(&state_shared.has_work, true);
        }

        params.type = GGML_TASK_FINALIZE;
        ggml_compute_forward(&params, node);

        // wait for thread pool
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) != 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }
        }

        // performance stats (node)
        {
            int64_t perf_cycles_cur  = ggml_perf_cycles()  - perf_node_start_cycles;
            int64_t perf_time_us_cur = ggml_perf_time_us() - perf_node_start_time_us;

            node->perf_runs++;
            node->perf_cycles  += perf_cycles_cur;
            node->perf_time_us += perf_time_us_cur;
        }
    }

    // join thread pool
    if (n_threads > 1) {
        atomic_store(&state_shared.stop, true);
        atomic_store(&state_shared.has_work, true);

        for (int j = 0; j < n_threads - 1; j++) {
            int rc = ggml_thread_join(workers[j].thrd, NULL);
            GGML_ASSERT(rc == 0);
            UNUSED(rc);
        }

        ggml_lock_destroy(&state_shared.spin);
    }

    // performance stats (graph)
    {
        int64_t perf_cycles_cur  = ggml_perf_cycles()  - perf_start_cycles;
        int64_t perf_time_us_cur = ggml_perf_time_us() - perf_start_time_us;

        cgraph->perf_runs++;
        cgraph->perf_cycles  += perf_cycles_cur;
        cgraph->perf_time_us += perf_time_us_cur;

        GGML_PRINT_DEBUG("%s: perf (%d) - cpu = %.3f / %.3f ms, wall = %.3f / %.3f ms\n",
                __func__, cgraph->perf_runs,
                (double) perf_cycles_cur      / (double) ggml_cycles_per_ms(),
                (double) cgraph->perf_cycles  / (double) ggml_cycles_per_ms() / (double) cgraph->perf_runs,
                (double) perf_time_us_cur     / 1000.0,
                (double) cgraph->perf_time_us / 1000.0 / cgraph->perf_runs);
    }
}